

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::ColumnDependencyManager::IsDependencyOf
          (ColumnDependencyManager *this,LogicalIndex gcol,LogicalIndex col)

{
  const_iterator cVar1;
  size_type sVar2;
  bool bVar3;
  key_type local_10;
  key_type local_8;
  
  local_10.index = col.index;
  local_8.index = gcol.index;
  cVar1 = ::std::
          _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->dependents_map)._M_h,&local_8);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar3 = false;
  }
  else {
    sVar2 = ::std::
            _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)((long)cVar1.
                              super__Node_iterator_base<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_true>
                              ._M_cur + 0x10),&local_10);
    bVar3 = sVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool ColumnDependencyManager::IsDependencyOf(LogicalIndex gcol, LogicalIndex col) const {
	auto entry = dependents_map.find(gcol);
	if (entry == dependents_map.end()) {
		return false;
	}
	auto &list = entry->second;
	return list.count(col);
}